

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O1

void __thiscall avro::NodeArray::~NodeArray(NodeArray *this)

{
  (this->super_NodeImplArray).super_Node._vptr_Node = (_func_int **)&PTR__NodeImpl_00192880;
  boost::detail::shared_count::~shared_count(&(this->super_NodeImplArray).leafAttributes_.attr_.pn);
  Node::~Node((Node *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

class AVRO_DECL NodeArray : public NodeImplArray
{
  public:

    NodeArray() :
        NodeImplArray(AVRO_ARRAY)
    { }

    explicit NodeArray(const SingleLeaf &items) :
        NodeImplArray(AVRO_ARRAY, NoName(), items, NoLeafNames(), NoSize())
    { }

    SchemaResolution resolve(const Node &reader)  const;

    void printJson(std::ostream &os, int depth) const;

    bool isValid() const {
        return (leafAttributes_.size() == 1);
    }
}